

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc *psVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  stbi_uc sVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint color;
  stbi_uc **ppsVar16;
  stbi_uc *psVar17;
  size_t sVar18;
  stbi_uc *psVar19;
  byte *pbVar20;
  bool bVar21;
  uint uVar22;
  ulong uVar23;
  stbi_uc *psVar24;
  ulong uVar25;
  byte bVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  stbi__uint32 raw_len_00;
  size_t __size;
  long lVar30;
  long lVar31;
  int local_524;
  stbi_uc tc [3];
  ulong local_4d0;
  stbi__uint32 raw_len;
  ulong local_4b0;
  stbi_uc *local_4a8;
  stbi_uc *local_4a0;
  stbi_uc *local_498;
  stbi_uc *local_490;
  ulong local_488;
  stbi_uc *local_480;
  stbi__context *local_478;
  size_t local_470;
  int local_468;
  int local_464;
  ulong local_460;
  long local_458;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar10 = stbi__check_png_header(s);
  if (iVar10 == 0) {
    local_524 = 0;
  }
  else {
    local_524 = 1;
    if (scan != 1) {
      ppsVar16 = &z->idata;
      local_498 = s->buffer_start;
      psVar1 = s->buffer_start + 1;
      bVar4 = true;
      local_460 = 0;
      color = 0;
      bVar5 = false;
      local_4d0 = 0;
      __size = 0;
      local_4b0 = 0;
      bVar6 = false;
      bVar26 = 0;
      do {
        iVar10 = stbi__get16be(s);
        uVar11 = stbi__get16be(s);
        uVar14 = uVar11 + iVar10 * 0x10000;
        uVar12 = stbi__get16be(s);
        uVar13 = stbi__get16be(s);
        psVar17 = local_498;
        uVar27 = uVar12 << 0x10 | uVar13;
        uVar22 = (uint)local_4d0;
        if ((int)uVar27 < 0x49484452) {
          if (uVar27 == 0x43674249) {
            bVar5 = true;
LAB_00110811:
            stbi__skip(s,uVar14);
LAB_00110b6e:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar3 = true;
          }
          else {
            iVar10 = (int)local_4b0;
            if (uVar27 == 0x49444154) {
              if (bVar4) {
LAB_001108e8:
                stbi__g_failure_reason = "first not IHDR";
                bVar4 = true;
                goto LAB_00110900;
              }
              if ((bVar26 != 0) && (uVar22 == 0)) {
                stbi__g_failure_reason = "no PLTE";
                bVar4 = false;
                local_4d0 = 0;
                goto LAB_00110900;
              }
              if (scan == 2) {
                s->img_n = (uint)bVar26;
                local_524 = 1;
                bVar4 = false;
                goto LAB_00111672;
              }
              uVar11 = uVar14 + iVar10;
              if (iVar10 <= (int)uVar11) {
                if ((uint)__size < uVar11) {
                  sVar18 = 0x1000;
                  if (0x1000 < uVar14) {
                    sVar18 = (ulong)uVar14;
                  }
                  if ((uint)__size != 0) {
                    sVar18 = __size;
                  }
                  do {
                    __size = sVar18;
                    sVar18 = (ulong)((uint)__size * 2);
                  } while ((uint)__size < uVar11);
                  psVar17 = (stbi_uc *)realloc(*ppsVar16,__size);
                  if (psVar17 == (stbi_uc *)0x0) {
                    stbi__g_failure_reason = "outofmem";
                    goto LAB_00111495;
                  }
                  *ppsVar16 = psVar17;
                }
                iVar10 = stbi__getn(s,*ppsVar16 + (local_4b0 & 0xffffffff),uVar14);
                if (iVar10 != 0) {
                  bVar4 = false;
                  local_4b0 = (ulong)uVar11;
                  goto LAB_00110b6e;
                }
                stbi__g_failure_reason = "outofdata";
              }
LAB_00111495:
              bVar4 = false;
              local_524 = 0;
              bVar3 = false;
            }
            else {
              if (uVar27 != 0x49454e44) {
LAB_00110849:
                if (bVar4) goto LAB_001108e8;
                bVar4 = false;
                if ((uVar12 >> 0xd & 1) == 0) {
                  stbi__parse_png_file::invalid_chunk[0] = (char)(uVar27 >> 0x18);
                  stbi__parse_png_file::invalid_chunk[1] = (char)(uVar27 >> 0x10);
                  stbi__parse_png_file::invalid_chunk[2] = (char)(uVar13 >> 8);
                  stbi__parse_png_file::invalid_chunk[3] = (char)uVar13;
                  stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
                  goto LAB_00110b8c;
                }
                goto LAB_00110811;
              }
              if (bVar4) {
                stbi__g_failure_reason = "first not IHDR";
LAB_0011074e:
                local_524 = 0;
              }
              else if (scan == 0) {
                if (*ppsVar16 == (stbi_uc *)0x0) {
                  stbi__g_failure_reason = "no IDAT";
                  goto LAB_0011074e;
                }
                raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
                psVar17 = (stbi_uc *)
                          stbi_zlib_decode_malloc_guesssize_headerflag
                                    ((char *)*ppsVar16,iVar10,raw_len,(int *)&raw_len,(uint)!bVar5);
                z->expanded = psVar17;
                local_524 = 0;
                if (psVar17 != (stbi_uc *)0x0) {
                  free(*ppsVar16);
                  raw_len_00 = raw_len;
                  *ppsVar16 = (stbi_uc *)0x0;
                  iVar10 = s->img_n + 1;
                  if (bVar6 || (bVar26 == 0 && req_comp != 3) && iVar10 == req_comp) {
                    s->img_out_n = iVar10;
                  }
                  else {
                    s->img_out_n = s->img_n;
                  }
                  iVar10 = s->img_out_n;
                  iVar15 = z->depth;
                  iVar28 = iVar10 << (iVar15 == 0x10);
                  x = z->s->img_x;
                  y = z->s->img_y;
                  if ((int)local_460 == 0) {
                    iVar10 = stbi__create_png_image_raw
                                       (z,z->expanded,raw_len,iVar10,x,y,iVar15,color);
                    if (iVar10 == 0) goto LAB_00111672;
                  }
                  else {
                    local_4a8 = z->expanded;
                    local_4a0 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar28,0);
                    local_470 = (size_t)iVar28;
                    lVar31 = 0;
                    psVar17 = local_4a8;
                    local_468 = iVar10;
                    do {
                      psVar2 = z->s;
                      local_490 = (stbi_uc *)(long)(int)(&DAT_001174f0)[lVar31];
                      uVar14 = (&DAT_00117530)[lVar31];
                      uVar27 = ~(&DAT_001174f0)[lVar31] + psVar2->img_x + uVar14;
                      uVar12 = uVar27 / uVar14;
                      uVar11 = (&DAT_00117550)[lVar31];
                      local_478 = (stbi__context *)CONCAT44(local_478._4_4_,(&DAT_00117510)[lVar31])
                      ;
                      uVar22 = ~(&DAT_00117510)[lVar31] + psVar2->img_y + uVar11;
                      uVar13 = uVar22 / uVar11;
                      bVar3 = true;
                      if ((uVar14 <= uVar27) && (uVar11 <= uVar22)) {
                        local_464 = uVar12 * iVar15 * psVar2->img_n;
                        local_4a8 = psVar17;
                        local_480 = (stbi_uc *)(long)(int)uVar14;
                        local_458 = lVar31;
                        iVar28 = stbi__create_png_image_raw
                                           (z,psVar17,raw_len_00,iVar10,uVar12,uVar13,iVar15,color);
                        if (iVar28 == 0) {
                          free(local_4a0);
                          bVar3 = false;
                          psVar17 = local_4a8;
                          lVar31 = local_458;
                        }
                        else {
                          if (0 < (int)uVar13) {
                            iVar10 = (int)local_470;
                            iVar28 = (int)local_478 * iVar10;
                            local_490 = local_4a0 + (long)local_490 * local_470;
                            lVar31 = (long)local_480 * local_470;
                            local_488 = 0;
                            sVar18 = local_470;
                            do {
                              if (0 < (int)uVar12) {
                                local_478 = z->s;
                                local_480 = z->out;
                                lVar29 = local_488 * (long)(int)uVar12;
                                lVar30 = 0;
                                psVar17 = local_490;
                                do {
                                  memcpy(psVar17 + local_478->img_x * iVar28,
                                         local_480 + (lVar29 + lVar30) * sVar18,local_470);
                                  lVar30 = lVar30 + 1;
                                  psVar17 = psVar17 + lVar31;
                                  sVar18 = local_470;
                                } while (lVar30 < (int)uVar12);
                              }
                              local_488 = local_488 + 1;
                              iVar28 = iVar28 + uVar11 * iVar10;
                            } while (local_488 < uVar13);
                          }
                          uVar13 = ((local_464 + 7 >> 3) + 1) * uVar13;
                          free(z->out);
                          raw_len_00 = raw_len_00 - uVar13;
                          bVar3 = true;
                          psVar17 = local_4a8 + uVar13;
                          lVar31 = local_458;
                          iVar10 = local_468;
                        }
                      }
                      if (!bVar3) goto LAB_00111672;
                      lVar31 = lVar31 + 1;
                    } while (lVar31 != 7);
                    z->out = local_4a0;
                  }
                  if (bVar6) {
                    if (z->depth == 0x10) {
                      stbi__compute_transparency16(z,tc16,s->img_out_n);
                    }
                    else {
                      stbi__compute_transparency(z,tc,s->img_out_n);
                    }
                  }
                  if (((bVar5) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                    stbi__de_iphone(z);
                  }
                  if (bVar26 == 0) {
                    if (bVar6) {
                      s->img_n = s->img_n + 1;
                    }
                  }
                  else {
                    s->img_n = (uint)bVar26;
                    uVar14 = (uint)bVar26;
                    if (2 < req_comp) {
                      uVar14 = req_comp;
                    }
                    s->img_out_n = uVar14;
                    psVar17 = z->out;
                    uVar11 = z->s->img_y * z->s->img_x;
                    psVar19 = (stbi_uc *)stbi__malloc_mad2(uVar11,uVar14,0);
                    if (psVar19 == (stbi_uc *)0x0) {
                      stbi__g_failure_reason = "outofmem";
                    }
                    else {
                      if (uVar14 == 3) {
                        if (uVar11 != 0) {
                          uVar23 = 0;
                          psVar24 = psVar19;
                          do {
                            uVar25 = (ulong)psVar17[uVar23];
                            *psVar24 = palette[uVar25 * 4];
                            psVar24[1] = palette[uVar25 * 4 + 1];
                            psVar24[2] = palette[uVar25 * 4 + 2];
                            psVar24 = psVar24 + 3;
                            uVar23 = uVar23 + 1;
                          } while (uVar11 != uVar23);
                        }
                      }
                      else if (uVar11 != 0) {
                        uVar23 = 0;
                        do {
                          uVar25 = (ulong)psVar17[uVar23];
                          psVar19[uVar23 * 4] = palette[uVar25 * 4];
                          psVar19[uVar23 * 4 + 1] = palette[uVar25 * 4 + 1];
                          psVar19[uVar23 * 4 + 2] = palette[uVar25 * 4 + 2];
                          psVar19[uVar23 * 4 + 3] = palette[uVar25 * 4 + 3];
                          uVar23 = uVar23 + 1;
                        } while (uVar11 != uVar23);
                      }
                      free(psVar17);
                      z->out = psVar19;
                    }
                    if (psVar19 == (stbi_uc *)0x0) goto LAB_00111672;
                  }
                  free(z->expanded);
                  z->expanded = (stbi_uc *)0x0;
                  goto LAB_00110956;
                }
              }
              else {
LAB_00110956:
                local_524 = 1;
              }
LAB_00111672:
              bVar3 = false;
            }
          }
        }
        else if (uVar27 == 0x74524e53) {
          if (bVar4) {
            stbi__g_failure_reason = "first not IHDR";
            bVar4 = true;
LAB_00110934:
            local_524 = 0;
          }
          else {
            if (*ppsVar16 != (stbi_uc *)0x0) {
              stbi__g_failure_reason = "tRNS after IDAT";
LAB_00110923:
              bVar4 = false;
              goto LAB_00110934;
            }
            if (bVar26 == 0) {
              if ((s->img_n & 1U) == 0) {
                stbi__g_failure_reason = "tRNS with alpha";
              }
              else {
                if (s->img_n * 2 == uVar14) {
                  bVar6 = true;
                  if (z->depth == 0x10) {
                    if (0 < s->img_n) {
                      lVar31 = 0;
                      do {
                        iVar10 = stbi__get16be(s);
                        tc16[lVar31] = (stbi__uint16)iVar10;
                        lVar31 = lVar31 + 1;
                      } while (lVar31 < s->img_n);
                    }
                  }
                  else if (0 < s->img_n) {
                    lVar31 = 0;
                    do {
                      iVar10 = stbi__get16be(s);
                      tc[lVar31] = ""[z->depth] * (char)iVar10;
                      lVar31 = lVar31 + 1;
                    } while (lVar31 < s->img_n);
                  }
                  bVar4 = false;
                  bVar26 = 0;
                  goto LAB_00110b6e;
                }
                stbi__g_failure_reason = "bad tRNS len";
              }
              bVar4 = false;
              bVar26 = 0;
              goto LAB_00110900;
            }
            if (scan != 2) {
              if (uVar22 == 0) {
                stbi__g_failure_reason = "tRNS before PLTE";
                bVar4 = false;
                local_4d0 = 0;
                goto LAB_00110934;
              }
              if (uVar14 <= uVar22) {
                bVar4 = false;
                bVar26 = 4;
                if (uVar14 != 0) {
                  uVar23 = 0;
                  do {
                    psVar19 = s->img_buffer;
                    if (psVar19 < s->img_buffer_end) {
LAB_0011125e:
                      s->img_buffer = psVar19 + 1;
                      sVar8 = *psVar19;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                        if (iVar15 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar17;
                          s->img_buffer_end = psVar1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar17;
                          s->img_buffer_end = psVar17 + iVar15;
                        }
                        psVar19 = s->img_buffer;
                        goto LAB_0011125e;
                      }
                      sVar8 = '\0';
                    }
                    palette[uVar23 * 4 + 3] = sVar8;
                    uVar23 = uVar23 + 1;
                    bVar26 = 4;
                  } while (uVar11 + iVar10 * 0x10000 != uVar23);
                }
                goto LAB_00110b6e;
              }
              stbi__g_failure_reason = "bad tRNS len";
              goto LAB_00110923;
            }
            s->img_n = 4;
            local_524 = 1;
            bVar4 = false;
          }
          bVar3 = false;
        }
        else {
          if (uVar27 == 0x504c5445) {
            if (bVar4) goto LAB_001108e8;
            if ((uVar14 < 0x301) &&
               (local_4d0 = (ulong)uVar11 * 0x55555556 >> 0x20,
               (int)((ulong)uVar11 * 0x55555556 >> 0x20) * 3 == uVar14)) {
              bVar4 = false;
              if (2 < uVar11) {
                uVar23 = 0;
                do {
                  psVar19 = s->img_buffer;
                  if (psVar19 < s->img_buffer_end) {
LAB_00110a21:
                    s->img_buffer = psVar19 + 1;
                    sVar8 = *psVar19;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar17 + iVar10;
                      }
                      psVar19 = s->img_buffer;
                      goto LAB_00110a21;
                    }
                    sVar8 = '\0';
                  }
                  palette[uVar23 * 4] = sVar8;
                  psVar19 = s->img_buffer;
                  if (psVar19 < s->img_buffer_end) {
LAB_00110a9b:
                    s->img_buffer = psVar19 + 1;
                    sVar8 = *psVar19;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar17 + iVar10;
                      }
                      psVar19 = s->img_buffer;
                      goto LAB_00110a9b;
                    }
                    sVar8 = '\0';
                  }
                  palette[uVar23 * 4 + 1] = sVar8;
                  psVar19 = s->img_buffer;
                  if (psVar19 < s->img_buffer_end) {
LAB_00110b15:
                    s->img_buffer = psVar19 + 1;
                    sVar8 = *psVar19;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar17 + iVar10;
                      }
                      psVar19 = s->img_buffer;
                      goto LAB_00110b15;
                    }
                    sVar8 = '\0';
                  }
                  palette[uVar23 * 4 + 2] = sVar8;
                  palette[uVar23 * 4 + 3] = 0xff;
                  uVar23 = uVar23 + 1;
                } while (local_4d0 != uVar23);
              }
              goto LAB_00110b6e;
            }
            stbi__g_failure_reason = "invalid PLTE";
LAB_00110b8c:
            bVar4 = false;
LAB_00110900:
            bVar3 = false;
            local_524 = 0;
            goto LAB_00111674;
          }
          if (uVar27 != 0x49484452) goto LAB_00110849;
          if (bVar4) {
            if (uVar14 != 0xd) {
              stbi__g_failure_reason = "bad IHDR len";
              goto LAB_00110b51;
            }
            iVar10 = stbi__get16be(s);
            uVar14 = stbi__get16be(s);
            psVar17 = local_498;
            uVar14 = uVar14 | iVar10 << 0x10;
            s->img_x = uVar14;
            if (0x1000000 < uVar14) {
LAB_001107f3:
              stbi__g_failure_reason = "too large";
              goto LAB_00110b51;
            }
            iVar10 = stbi__get16be(s);
            uVar14 = stbi__get16be(s);
            uVar14 = uVar14 | iVar10 << 0x10;
            s->img_y = uVar14;
            if (0x1000000 < uVar14) goto LAB_001107f3;
            pbVar20 = s->img_buffer;
            if (pbVar20 < s->img_buffer_end) {
LAB_001113a4:
              s->img_buffer = pbVar20 + 1;
              bVar7 = *pbVar20;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                if (iVar10 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar17;
                  s->img_buffer_end = psVar1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar17;
                  s->img_buffer_end = psVar17 + iVar10;
                }
                pbVar20 = s->img_buffer;
                goto LAB_001113a4;
              }
              bVar7 = 0;
            }
            z->depth = (uint)bVar7;
            if ((0x10 < bVar7) || ((0x10116U >> (bVar7 & 0x1f) & 1) == 0)) {
              stbi__g_failure_reason = "1/2/4/8/16-bit only";
              goto LAB_00110b51;
            }
            pbVar20 = s->img_buffer;
            if (pbVar20 < s->img_buffer_end) {
LAB_001114d0:
              s->img_buffer = pbVar20 + 1;
              bVar7 = *pbVar20;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                if (iVar10 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar17;
                  s->img_buffer_end = psVar1;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar17;
                  s->img_buffer_end = psVar17 + iVar10;
                }
                pbVar20 = s->img_buffer;
                goto LAB_001114d0;
              }
              bVar7 = 0;
            }
            color = (uint)bVar7;
            if (bVar7 < 7) {
              if (bVar7 != 3) {
                bVar9 = bVar26;
                if ((bVar7 & 1) == 0) goto LAB_00111547;
                goto LAB_001114fb;
              }
              bVar9 = 3;
              if (z->depth == 0x10) {
                color = 3;
                goto LAB_001114fb;
              }
LAB_00111547:
              bVar26 = bVar9;
              psVar19 = s->img_buffer;
              if (psVar19 < s->img_buffer_end) {
LAB_001116b7:
                s->img_buffer = psVar19 + 1;
                if (*psVar19 == '\0') goto LAB_001116d3;
                stbi__g_failure_reason = "bad comp method";
LAB_0011175d:
                bVar21 = false;
                local_524 = 0;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                  if (iVar10 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar17;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar17;
                    s->img_buffer_end = psVar17 + iVar10;
                  }
                  psVar19 = s->img_buffer;
                  goto LAB_001116b7;
                }
LAB_001116d3:
                sVar8 = stbi__get8(s);
                if (sVar8 != '\0') {
                  stbi__g_failure_reason = "bad filter method";
                  goto LAB_0011175d;
                }
                bVar9 = stbi__get8(s);
                local_460 = (ulong)bVar9;
                if (1 < bVar9) {
                  stbi__g_failure_reason = "bad interlace method";
                  goto LAB_0011175d;
                }
                uVar14 = s->img_x;
                if ((uVar14 == 0) || (uVar11 = s->img_y, uVar11 == 0)) {
                  stbi__g_failure_reason = "0-pixel image";
                  goto LAB_0011175d;
                }
                if (bVar26 == 0) {
                  uVar12 = (3 < bVar7) + 1 + (bVar7 & 2);
                  s->img_n = uVar12;
                  if ((uint)((0x40000000 / (ulong)uVar14) / (ulong)uVar12) < uVar11) {
                    stbi__g_failure_reason = "too large";
                    bVar26 = 0;
                    goto LAB_00110b51;
                  }
                  if (scan != 2) goto LAB_001117e5;
                  local_524 = 1;
                  bVar21 = false;
                  bVar26 = 0;
                }
                else {
                  s->img_n = 1;
                  if ((uint)(0x40000000 / (ulong)uVar14 >> 2) < uVar11) {
                    stbi__g_failure_reason = "too large";
                    goto LAB_00110b51;
                  }
LAB_001117e5:
                  bVar21 = true;
                }
              }
            }
            else {
LAB_001114fb:
              stbi__g_failure_reason = "bad ctype";
              bVar21 = false;
              local_524 = 0;
            }
          }
          else {
            stbi__g_failure_reason = "multiple IHDR";
LAB_00110b51:
            bVar21 = false;
            local_524 = 0;
          }
          bVar4 = false;
          bVar3 = false;
          if (bVar21) goto LAB_00110b6e;
        }
LAB_00111674:
      } while (bVar3);
    }
  }
  return local_524;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}